

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::~IfcTendonAnchor(IfcTendonAnchor *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x28 = 0x8abae8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x10 = 0x8abc28;
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x18) = 0x8abb10;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xc0 = 0x8abb38;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.Representation.have = 0x8abb60;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x128 = 0x8abb88;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.field_0x160
       = 0x8abbb0;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x170 = 0x8abbd8;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x180 = 0x8abc00;
  puVar1 = *(undefined1 **)&this[-1].super_IfcReinforcingElement.field_0x190;
  if (puVar1 != &this[-1].super_IfcReinforcingElement.field_0x1a0) {
    operator_delete(puVar1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x28,
             &PTR_construction_vtable_24__008ab8b0);
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}